

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall
punky::ast::FunctionLiteral::to_string_abi_cxx11_
          (string *__return_storage_ptr__,FunctionLiteral *this)

{
  BlockStmt *pBVar1;
  vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_> *pvVar2;
  pointer pIVar3;
  unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>
  *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Identifier *param;
  pointer pIVar5;
  string param_str;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  FunctionLiteral *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ExprNode::token_literal_abi_cxx11_(&local_b8,&this->super_ExprNode);
  std::operator+(__return_storage_ptr__,&local_b8,"(");
  std::__cxx11::string::~string((string *)&local_b8);
  pBVar1 = (this->m_body)._M_t.
           super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
           ._M_t.
           super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>
           .super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl;
  if (pBVar1 != (BlockStmt *)0x0) {
    if ((this->m_params).
        super__Optional_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
        ._M_engaged == true) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_78 = this;
      puVar4 = std::
               optional<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
               ::value(&this->m_params);
      pvVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_*,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>
               .
               super__Head_base<0UL,_std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_*,_false>
               ._M_head_impl;
      pIVar3 = *(pointer *)
                ((long)&(pvVar2->
                        super__Vector_base<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>
                        )._M_impl + 8);
      for (pIVar5 = *(pointer *)
                     &(pvVar2->
                      super__Vector_base<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>
                      )._M_impl; pIVar5 != pIVar3; pIVar5 = pIVar5 + 1) {
        (**(code **)(*(long *)&(pIVar5->super_ExprNode).super_AstNode + 0x18))(&local_70,pIVar5);
        std::operator+(&local_98,&local_70,", ");
        std::__cxx11::string::append((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_70);
      }
      if (2 < local_b8._M_string_length) {
        std::__cxx11::string::pop_back();
        std::__cxx11::string::pop_back();
      }
      std::operator+(&local_70,&local_b8,") ");
      (**(code **)(*(long *)&(((local_78->m_body)._M_t.
                               super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>
                               .super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl)
                             ->super_StmtNode).super_AstNode + 0x18))(&local_50);
      std::operator+(&local_98,&local_70,&local_50);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = &local_b8;
    }
    else {
      (**(code **)(*(long *)&(pBVar1->super_StmtNode).super_AstNode + 0x18))(&local_98);
      std::operator+(&local_b8,") ",&local_98);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b8);
      this_00 = &local_98;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionLiteral::to_string() const
{
    std::string fn_str{token_literal() + "("};
    if (m_body)
    {
        if (m_params.has_value())
        {
            std::string param_str;
            for (const auto& param : *m_params.value())
                param_str.append(param.to_string() + ", ");
            if (param_str.size() > 2)
            {
                param_str.pop_back();
                param_str.pop_back();
            }
            fn_str.append(param_str + ") " + m_body->to_string());
        }
        else
            fn_str.append(") " + m_body->to_string());
    }
    return fn_str;
}